

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O3

int lj_cf_buffer_method_get(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  uint uVar3;
  SBufExt *pSVar4;
  GCstr *pGVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  
  pSVar4 = buffer_tobuf(L);
  pTVar1 = L->top;
  lVar9 = (long)pTVar1 - (long)L->base;
  if (lVar9 == 8) {
    L->top = pTVar1 + 1;
    pTVar1->u64 = 0xffffffffffffffff;
    lVar9 = 2;
  }
  else {
    lVar9 = lVar9 >> 3;
    if (lVar9 < 2) {
      pcVar7 = pSVar4->r;
      goto LAB_001311a2;
    }
  }
  lVar8 = 1;
  do {
    pTVar1 = L->base;
    uVar3 = 0x7fffff00;
    if (pTVar1[lVar8].u64 != 0xffffffffffffffff) {
      uVar3 = lj_lib_checkintrange(L,(int)lVar8 + 1,0,0x7fffff00);
    }
    uVar6 = *(int *)&pSVar4->w - (int)pSVar4->r;
    if (uVar3 < uVar6) {
      uVar6 = uVar3;
    }
    pGVar5 = lj_str_new(L,pSVar4->r,(ulong)uVar6);
    pTVar1[lVar8].u64 = (ulong)pGVar5 | 0xfffd800000000000;
    pcVar7 = pSVar4->r + uVar6;
    pSVar4->r = pcVar7;
    lVar8 = lVar8 + 1;
  } while (lVar9 != lVar8);
LAB_001311a2:
  if ((pcVar7 == pSVar4->w) && (((pSVar4->L).ptr64 & 2) == 0)) {
    pSVar4->w = pSVar4->b;
    pSVar4->r = pSVar4->b;
  }
  uVar2 = (L->glref).ptr64;
  if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
    lj_gc_step(L);
  }
  return (int)lVar9 + -1;
}

Assistant:

LJLIB_CF(buffer_method_get)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  ptrdiff_t arg, narg = L->top - L->base;
  if (narg == 1) {
    narg++;
    setnilV(L->top++);  /* get() is the same as get(nil). */
  }
  for (arg = 1; arg < narg; arg++) {
    TValue *o = &L->base[arg];
    MSize n = tvisnil(o) ? LJ_MAX_BUF :
	      (MSize) lj_lib_checkintrange(L, (int)(arg+1), 0, LJ_MAX_BUF);
    MSize len = sbufxlen(sbx);
    if (n > len) n = len;
    setstrV(L, o, lj_str_new(L, sbx->r, n));
    sbx->r += n;
  }
  if (sbx->r == sbx->w && !sbufiscow(sbx)) sbx->r = sbx->w = sbx->b;
  lj_gc_check(L);
  return (int)(narg-1);
}